

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::setButtonLayout(QWizardPrivate *this,WizardButton *array,int size)

{
  WizardButton which_00;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  WizardButton which;
  int i_1;
  QWidget *widget;
  QLayoutItem *item;
  int i;
  QWidget *prev;
  QWizardPrivate *in_stack_00000088;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QBoxLayout *in_stack_ffffffffffffff90;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QWidget *in_stack_ffffffffffffffa0;
  int iVar1;
  int iVar2;
  QWidget *in_stack_ffffffffffffffb8;
  QWizardPrivate *this_00;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)(in_RDI + 0x498);
  which_00 = (**(code **)(**(long **)(in_RDI + 0x4c0) + 200))();
  while (which_00 = which_00 + NoButton, NoButton < which_00) {
    in_stack_ffffffffffffffa0 =
         (QWidget *)
         (**(code **)(**(long **)(in_RDI + 0x4c0) + 0xb0))(*(long **)(in_RDI + 0x4c0),which_00);
    in_stack_ffffffffffffffb8 =
         (QWidget *)(**(code **)(*(long *)in_stack_ffffffffffffffa0 + 0x68))();
    if (in_stack_ffffffffffffffb8 != (QWidget *)0x0) {
      QWidget::hide((QWidget *)0x7b9b68);
    }
    if (in_stack_ffffffffffffffa0 != (QWidget *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa0 + 8))();
    }
  }
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    iVar1 = *(int *)(in_RSI + (long)iVar2 * 4);
    if (iVar1 == 9) {
      QBoxLayout::addStretch(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    else if (iVar1 != -1) {
      ensureButton(this_00,which_00);
      in_stack_ffffffffffffff90 = *(QBoxLayout **)(in_RDI + 0x4c0);
      alignment.i = (Int)((ulong)*(undefined8 *)(in_RDI + 0x420 + (long)iVar1 * 8) >> 0x20);
      memset(local_c,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b9c32);
      QBoxLayout::addWidget
                (in_stack_ffffffffffffff90,
                 (QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0,
                 (Alignment)alignment.i);
      if ((((iVar1 != 0) && (iVar1 != 1)) && (iVar1 != 2)) && (iVar1 != 3)) {
        QWidget::show(in_stack_ffffffffffffffa0);
      }
      if (this_00 != (QWizardPrivate *)0x0) {
        QWidget::setTabOrder(in_stack_ffffffffffffffb8,(QWidget *)CONCAT44(iVar2,iVar1));
      }
      this_00 = *(QWizardPrivate **)(in_RDI + 0x420 + (long)iVar1 * 8);
    }
  }
  _q_updateButtonStates(in_stack_00000088);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::setButtonLayout(const QWizard::WizardButton *array, int size)
{
    QWidget *prev = pageFrame;

    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    for (int i = 0; i < size; ++i) {
        QWizard::WizardButton which = array[i];
        if (which == QWizard::Stretch) {
            buttonLayout->addStretch(1);
        } else if (which != QWizard::NoButton) {
            ensureButton(which);
            buttonLayout->addWidget(btns[which]);

            // Back, Next, Commit, and Finish are handled in _q_updateButtonStates()
            if (which != QWizard::BackButton && which != QWizard::NextButton
                && which != QWizard::CommitButton && which != QWizard::FinishButton)
                btns[which]->show();

            if (prev)
                QWidget::setTabOrder(prev, btns[which]);
            prev = btns[which];
        }
    }

    _q_updateButtonStates();
}